

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilUtil.c
# Opt level: O0

int Extra_UtilGetopt(int argc,char **argv,char *optstring)

{
  char *pcVar1;
  char *place;
  int c;
  char *optstring_local;
  char **argv_local;
  int argc_local;
  
  globalUtilOptarg = (char *)0x0;
  if ((pScanStr == (char *)0x0) || (*pScanStr == '\0')) {
    if (globalUtilOptind == 0) {
      globalUtilOptind = 1;
    }
    if (argc <= globalUtilOptind) {
      globalUtilOptarg = (char *)0x0;
      return -1;
    }
    pcVar1 = argv[globalUtilOptind];
    if ((*pcVar1 != '-') || (pcVar1[1] == '\0')) {
      globalUtilOptarg = (char *)0x0;
      return -1;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((pcVar1[1] == '-') && (pcVar1[2] == '\0')) {
      globalUtilOptarg = (char *)0x0;
      return -1;
    }
    pScanStr = pcVar1 + 1;
  }
  argv_local._4_4_ = (uint)*pScanStr;
  pScanStr = pScanStr + 1;
  pcVar1 = strchr(optstring,argv_local._4_4_);
  if ((pcVar1 == (char *)0x0) || (argv_local._4_4_ == 0x3a)) {
    fprintf(_stderr,"%s: unknown option %c\n",*argv,(ulong)argv_local._4_4_);
    argv_local._4_4_ = 0x3f;
  }
  else if (pcVar1[1] == ':') {
    if (*pScanStr == '\0') {
      if (globalUtilOptind < argc) {
        globalUtilOptarg = argv[globalUtilOptind];
        globalUtilOptind = globalUtilOptind + 1;
      }
      else {
        fprintf(_stderr,"%s: %c requires an argument\n",*argv,(ulong)argv_local._4_4_);
        argv_local._4_4_ = 0x3f;
      }
    }
    else {
      globalUtilOptarg = pScanStr;
      pScanStr = (char *)0x0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int Extra_UtilGetopt( int argc, char *argv[], const char *optstring )
{
    register int c;
    register const char *place;

    globalUtilOptarg = NULL;

    if (pScanStr == NULL || *pScanStr == '\0') 
    {
        if (globalUtilOptind == 0) 
            globalUtilOptind++;
        if (globalUtilOptind >= argc) 
            return EOF;
        place = argv[globalUtilOptind];
        if (place[0] != '-' || place[1] == '\0') 
            return EOF;
        globalUtilOptind++;
        if (place[1] == '-' && place[2] == '\0') 
            return EOF;
        pScanStr = place+1;
    }

    c = *pScanStr++;
    place = strchr(optstring, c);
    if (place == NULL || c == ':') {
        (void) fprintf(stderr, "%s: unknown option %c\n", argv[0], c);
        return '?';
    }
    if (*++place == ':') 
    {
        if (*pScanStr != '\0') 
        {
            globalUtilOptarg = pScanStr;
            pScanStr = NULL;
        } 
        else 
        {
            if (globalUtilOptind >= argc) 
            {
                (void) fprintf(stderr, "%s: %c requires an argument\n", 
                    argv[0], c);
                return '?';
            }
            globalUtilOptarg = argv[globalUtilOptind];
            globalUtilOptind++;
        }
    }
    return c;
}